

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O1

void __thiscall
baryonyx::itm::
solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
::solver_equalities_101coeff
          (solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  pointer pmVar1;
  pointer pfVar2;
  undefined1 auVar3 [16];
  float *pfVar4;
  int *__s;
  rc_data *__s_00;
  bound_factor *__s_01;
  undefined8 extraout_RAX;
  pointer *ppfVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  pointer pfVar9;
  int *piVar10;
  ulong uVar11;
  
  (this->super_debug_logger<false>).ofs = (FILE *)0x0;
  this->rng = rng_;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  uVar11 = (ulong)(this->ap).m_rows_values.m_length << 2;
  pfVar4 = (float *)operator_new__(uVar11);
  memset(pfVar4,0,uVar11);
  (this->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar4;
  __s = (int *)operator_new__(uVar11);
  memset(__s,0,uVar11);
  (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = __s;
  pmVar1 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (long)*(pointer *)
                  ((long)&(pmVar1->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl + 8) -
           *(long *)&(pmVar1->elements).
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl >> 3;
  lVar7 = (long)(csts->
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar1;
  if (lVar7 != 0x28) {
    lVar7 = (lVar7 >> 3) * -0x3333333333333333 + -1;
    ppfVar5 = (pointer *)
              ((long)&pmVar1[1].elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl + 8);
    do {
      uVar8 = (long)*ppfVar5 - (long)((_Vector_impl_data *)(ppfVar5 + -1))->_M_start >> 3;
      if (uVar11 <= uVar8) {
        uVar11 = uVar8;
      }
      ppfVar5 = ppfVar5 + 5;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar11;
  uVar11 = SUB168(auVar3 * ZEXT816(0xc),0);
  if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  __s_00 = (rc_data *)operator_new__(uVar11);
  memset(__s_00,0,uVar11);
  (this->R)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
  ._M_head_impl = __s_00;
  uVar11 = (long)m_ * 8;
  if (m_ < 0) {
    uVar11 = 0xffffffffffffffff;
  }
  __s_01 = (bound_factor *)operator_new__(uVar11);
  memset(__s_01,0,uVar11);
  (this->b)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor_*,_false>
  ._M_head_impl = __s_01;
  uVar11 = 0xffffffffffffffff;
  if (-1 < m_) {
    uVar11 = (long)m_ << 2;
  }
  pfVar4 = (float *)operator_new__(uVar11);
  iVar6 = 0;
  memset(pfVar4,0,uVar11);
  (this->pi)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar4;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  if (m_ != 0) {
    pmVar1 = (csts->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar11 = 0;
    do {
      __s_01[uVar11].negative_factor = 0;
      __s_01[uVar11].value = pmVar1[uVar11].min;
      pfVar9 = *(pointer *)
                &pmVar1[uVar11].elements.
                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                 ._M_impl;
      pfVar2 = *(pointer *)
                ((long)&pmVar1[uVar11].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      if (pfVar9 != pfVar2) {
        piVar10 = __s + iVar6;
        do {
          if ((pfVar9->factor + 1U & 0xfffffffd) != 0) {
            itm::solver_equalities_101coeff();
            goto LAB_0029d7ab;
          }
          *piVar10 = pfVar9->factor;
          if (pfVar9->factor < 0) {
            __s_01[uVar11].negative_factor = __s_01[uVar11].negative_factor + 1;
          }
          pfVar9 = pfVar9 + 1;
          piVar10 = piVar10 + 1;
          iVar6 = iVar6 + 1;
        } while (pfVar9 != pfVar2);
      }
      if (pmVar1[uVar11].min != pmVar1[uVar11].max) {
LAB_0029d7ab:
        itm::solver_equalities_101coeff();
        operator_delete__(__s_01);
        __s[0x1a] = 0;
        __s[0x1b] = 0;
        if (*(void **)(__s + 0x18) != (void *)0x0) {
          operator_delete__(*(void **)(__s + 0x18));
        }
        __s[0x18] = 0;
        __s[0x19] = 0;
        if (*(void **)(__s + 0x16) != (void *)0x0) {
          operator_delete__(*(void **)(__s + 0x16));
        }
        __s[0x16] = 0;
        __s[0x17] = 0;
        if (*(void **)(__s + 0x14) != (void *)0x0) {
          operator_delete__(*(void **)(__s + 0x14));
        }
        __s[0x14] = 0;
        __s[0x15] = 0;
        sparse_matrix<int>::~sparse_matrix(&this->ap);
        _Unwind_Resume(extraout_RAX);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uint)m_);
  }
  return;
}

Assistant:

solver_equalities_101coeff(random_engine& rng_,
                               int m_,
                               int n_,
                               const cost_type& c_,
                               const std::vector<merged_constraint>& csts)
      : logger("solver_equalities_101coeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , A(std::make_unique<int[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        int id = 0;
        for (int i = 0; i != m; ++i) {
            b[i].negative_factor = 0;
            b[i].value = csts[i].min;

            for (const auto& cst : csts[i].elements) {
                bx_ensures(std::abs(cst.factor) == 1);
                A[id++] = cst.factor;

                if (cst.factor < 0)
                    ++b[i].negative_factor;
            }

            bx_ensures(csts[i].min == csts[i].max);
        }
    }